

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O0

value_type
mxx::
global_reduce<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>,MxxReduce_GlobalReduce_Test::TestBody()::__0>
          (__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> begin,
          __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> end,
          comm *param_3)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  difference_type dVar4;
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> _Var5;
  reference plVar6;
  MPI_Datatype poVar7;
  MPI_Comm poVar8;
  long lVar9;
  long local_d0;
  T init;
  datatype dt;
  int bcast_src;
  long *local_80;
  T result;
  int bcast_rank;
  comm nonzero_comm;
  size_t n;
  comm *comm_local;
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> end_local;
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> begin_local;
  
  end_local._M_current = begin._M_current;
  dVar4 = std::
          distance<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>>
                    (begin,end);
  nonzero_comm._28_4_ = ZEXT14(dVar4 != 0);
  iVar2 = allreduce<int,mxx::global_reduce<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>,MxxReduce_GlobalReduce_Test::TestBody()::__0>(__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>,MxxReduce_GlobalReduce_Test::TestBody()::__0,mxx::comm_const&)::_lambda(int,int)_1_>
                    (&nonzero_comm.field_0x1c,param_3);
  if (iVar2 != 0) {
    if (dVar4 != 0) {
      _Var5 = __gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
              ::operator+(&end_local,1);
      plVar6 = __gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
               ::operator*(&end_local);
      local_d0 = std::
                 accumulate<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>,long,MxxReduce_GlobalReduce_Test::TestBody()::__0>
                           (_Var5._M_current,end._M_current,*plVar6);
      lVar9 = allreduce<long,MxxReduce_GlobalReduce_Test::TestBody()::__0>(&local_d0,param_3);
      return lVar9;
    }
    __assert_fail("n >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/reduction.hpp"
                  ,0x20a,
                  "typename std::iterator_traits<Iterator>::value_type mxx::global_reduce(Iterator, Iterator, Func, const mxx::comm &) [Iterator = __gnu_cxx::__normal_iterator<const long *, std::vector<long>>, Func = (lambda at /workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp:242:47)]"
                 );
  }
  comm::split((comm *)&bcast_rank,param_3,(uint)(dVar4 != 0));
  if (dVar4 == 0) {
    iVar2 = comm::size((comm *)&bcast_rank);
    iVar3 = comm::size(param_3);
    if (iVar2 == iVar3) {
      begin_local._M_current = (long *)0x0;
      result._4_4_ = 1;
      goto LAB_0014a2dc;
    }
  }
  result._0_4_ = -1;
  if (dVar4 != 0) {
    _Var5 = __gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>::
            operator+(&end_local,1);
    plVar6 = __gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>::
             operator*(&end_local);
    local_80 = (long *)std::
                       accumulate<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>,long,MxxReduce_GlobalReduce_Test::TestBody()::__0>
                                 (_Var5._M_current,end._M_current,*plVar6);
    local_80 = (long *)reduce<long,MxxReduce_GlobalReduce_Test::TestBody()::__0>
                                 (&local_80,0,&bcast_rank);
    iVar2 = comm::rank((comm *)&bcast_rank);
    if (iVar2 == 0) {
      result._0_4_ = comm::rank(param_3);
    }
  }
  dt._20_4_ = allreduce<int,mxx::max<int>>(&result,param_3);
  get_datatype<long>();
  poVar7 = datatype::type((datatype *)&init);
  uVar1 = dt._20_4_;
  poVar8 = comm::operator_cast_to_ompi_communicator_t_(param_3);
  MPI_Bcast(&local_80,1,poVar7,uVar1,poVar8);
  begin_local._M_current = local_80;
  result._4_4_ = 1;
  datatype::~datatype((datatype *)&init);
LAB_0014a2dc:
  comm::~comm((comm *)&bcast_rank);
  return (value_type)begin_local._M_current;
}

Assistant:

inline typename std::iterator_traits<Iterator>::value_type global_reduce(Iterator begin, Iterator end, Func func, const mxx::comm& comm = mxx::comm()) {
    size_t n = std::distance(begin, end);
    typedef typename std::iterator_traits<Iterator>::value_type T;

    if (mxx::allreduce((int)(n >= 1), [](int x, int y) { return (int)(x && y); }, comm) == 0) {
        // some processors have 0 elements
        mxx::comm nonzero_comm = comm.split(n >= 1);
        if (n == 0 && nonzero_comm.size() == comm.size()) {
            // all processes have zero elements, thus return default value
            return T();
        }
        // otherwise reduce only over nonzero processors (subcommunicator)
        int bcast_rank = -1;
        T result;
        if (n >= 1) {
            // local reduction
            result = std::accumulate(begin+1, end, *begin, func);
            // reduction in nonzero subcommunicator
            result = reduce(result, 0, func, nonzero_comm);
            // determine rank of first element of nonzero comm
            if (nonzero_comm.rank() == 0)
                bcast_rank = comm.rank();
        }
        // get rank of processor for bcast
        int bcast_src = mxx::allreduce(bcast_rank, mxx::max<int>(), comm);
        mxx::datatype dt = mxx::get_datatype<T>();
        MPI_Bcast(&result, 1, dt.type(), bcast_src, comm);
        return result;
    } else {
        assert(n >= 1);
        T init = std::accumulate(begin+1, end, *begin, func);
        return allreduce(init, func, comm);
    }
}